

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O3

void hat_widget(nk_context *nk,uchar state)

{
  nk_widget_layout_states nVar1;
  nk_command_buffer *pnVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  nk_rect r;
  nk_rect area;
  nk_rect local_28;
  float local_18;
  float fStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  nVar1 = nk_widget(&local_28,&glfw.ctx);
  if (nVar1 != NK_WIDGET_INVALID) {
    fVar3 = local_28.w;
    fVar8 = local_28.h;
    fVar6 = fVar3 * 0.5 + local_28.x;
    fVar7 = fVar8 * 0.5 + local_28.y;
    if (fVar8 <= fVar3) {
      fVar3 = fVar8;
    }
    fVar3 = fVar3 * 0.5;
    pnVar2 = nk_window_get_canvas(&glfw.ctx);
    r.x = fVar6 - fVar3;
    r.y = fVar7 - fVar3;
    r.w = fVar3 + fVar3;
    r.h = r.w;
    nk_stroke_circle(pnVar2,r,1.0,(nk_color)0xffafafaf);
    if ((char)nk != '\0') {
      fVar5 = *(float *)(&DAT_00163a90 + ((ulong)nk & 0xff) * 4);
      fVar4 = ((((((fVar5 * -5.2302214e-14 + 0.000990141) * fVar5 + -0.018663716) * fVar5 +
                 0.1071238) * fVar5 + -0.11813404) * fVar5 + -0.39438233) * fVar5 + -0.038191997) *
              fVar5 + 1.002386;
      fVar5 = ((((((fVar5 * 0.00013823564 + -0.0030399605) * fVar5 + 0.02080266) * fVar5 +
                 -0.02673534) * fVar5 + -0.13807878) * fVar5 + -0.012127613) * fVar5 + 1.0008676) *
              fVar5 + 1.910593e-31;
      local_18 = fVar3 / -3.0;
      uStack_10 = 0;
      uStack_c = 0;
      fStack_14 = fVar8;
      pnVar2 = nk_window_get_canvas(&glfw.ctx);
      fVar8 = local_18 * fVar4 + fVar7;
      nk_fill_triangle(pnVar2,(fVar4 * 0.0 + fVar6) - fVar5 * fVar3,
                       (fVar7 - fVar3 * fVar4) - fVar5 * 0.0,
                       fVar4 * fVar3 * 0.5 + fVar6 + fVar5 * local_18,fVar8 - fVar3 * 0.5 * fVar5,
                       fVar4 * fVar3 * -0.5 + fVar6 + fVar5 * local_18,fVar8 - fVar3 * -0.5 * fVar5,
                       (nk_color)0xffafafaf);
    }
  }
  return;
}

Assistant:

static void hat_widget(struct nk_context* nk, unsigned char state)
{
    float radius;
    struct nk_rect area;
    struct nk_vec2 center;

    if (nk_widget(&area, nk) == NK_WIDGET_INVALID)
        return;

    center = nk_vec2(area.x + area.w / 2.f, area.y + area.h / 2.f);
    radius = NK_MIN(area.w, area.h) / 2.f;

    nk_stroke_circle(nk_window_get_canvas(nk),
                     nk_rect(center.x - radius,
                             center.y - radius,
                             radius * 2.f,
                             radius * 2.f),
                     1.f,
                     nk_rgb(175, 175, 175));

    if (state)
    {
        const float angles[] =
        {
            0.f,           0.f,
            NK_PI * 1.5f,  NK_PI * 1.75f,
            NK_PI,         0.f,
            NK_PI * 1.25f, 0.f,
            NK_PI * 0.5f,  NK_PI * 0.25f,
            0.f,           0.f,
            NK_PI * 0.75f, 0.f,
        };
        const float cosa = nk_cos(angles[state]);
        const float sina = nk_sin(angles[state]);
        const struct nk_vec2 p0 = nk_vec2(0.f, -radius);
        const struct nk_vec2 p1 = nk_vec2( radius / 2.f, -radius / 3.f);
        const struct nk_vec2 p2 = nk_vec2(-radius / 2.f, -radius / 3.f);

        nk_fill_triangle(nk_window_get_canvas(nk),
                         center.x + cosa * p0.x + sina * p0.y,
                         center.y + cosa * p0.y - sina * p0.x,
                         center.x + cosa * p1.x + sina * p1.y,
                         center.y + cosa * p1.y - sina * p1.x,
                         center.x + cosa * p2.x + sina * p2.y,
                         center.y + cosa * p2.y - sina * p2.x,
                         nk_rgb(175, 175, 175));
    }
}